

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<ASpecialSpot_*,_ASpecialSpot_*>::DoCopy
          (TArray<ASpecialSpot_*,_ASpecialSpot_*> *this,
          TArray<ASpecialSpot_*,_ASpecialSpot_*> *other)

{
  uint uVar1;
  ASpecialSpot **ppAVar2;
  uint i;
  ulong uVar3;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (ASpecialSpot **)0x0;
  }
  else {
    ppAVar2 = (ASpecialSpot **)
              M_Malloc_Dbg((ulong)uVar1 << 3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                           ,0x199);
    this->Array = ppAVar2;
    uVar1 = this->Count;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      this->Array[uVar3] = other->Array[uVar3];
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}